

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O1

void remove_inform_from_list
               (list<InformItem_*,_std::allocator<InformItem_*>_> *list,
               function<bool_(InformItem_*)> *predicate)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  InformItem *__ptr;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  bool bVar5;
  list<InformItem_*,_std::allocator<InformItem_*>_> __to_destroy;
  InformItem *local_50;
  _List_node_base local_48;
  long local_38;
  
  local_38 = 0;
  local_48._M_next = &local_48;
  local_48._M_prev = &local_48;
  p_Var2 = (list->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    p_Var3 = p_Var2;
    p_Var2 = local_48._M_next;
    if (p_Var3 == (_List_node_base *)list) {
      while (p_Var2 != &local_48) {
        p_Var3 = p_Var2->_M_next;
        operator_delete(p_Var2);
        p_Var2 = p_Var3;
      }
      return;
    }
    p_Var2 = p_Var3->_M_next;
    __ptr = (InformItem *)p_Var3[1]._M_next;
    local_50 = __ptr;
    if ((predicate->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    bVar5 = (*predicate->_M_invoker)((_Any_data *)predicate,&local_50);
    if ((bVar5) && (free(__ptr), p_Var3->_M_next != local_48._M_next && local_48._M_next != p_Var3))
    {
      std::__detail::_List_node_base::_M_transfer(local_48._M_next,p_Var3);
      local_38 = local_38 + 1;
      psVar1 = &(list->super__List_base<InformItem_*,_std::allocator<InformItem_*>_>)._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
    }
  }
  uVar4 = std::__throw_bad_function_call();
  p_Var2 = local_48._M_next;
  while (p_Var2 != &local_48) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var3;
  }
  _Unwind_Resume(uVar4);
}

Assistant:

static void remove_inform_from_list(std::list<struct InformItem *> &list,
                             std::function<bool(struct InformItem *)> predicate) {
    list.remove_if([&predicate](struct InformItem* item){
        if(predicate(item)){
            delete_inform(item);
            return true;
        }
        return false;
    });
}